

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O2

UnicodeString *
icu_63::TimeZone::getEquivalentID
          (UnicodeString *__return_storage_ptr__,UnicodeString *id,int32_t index)

{
  UResourceBundle *resB;
  int32_t *piVar1;
  UResourceBundle *resB_00;
  int32_t indexS;
  UErrorCode ec;
  int32_t size;
  ConstChar16Ptr local_1d0;
  UChar *local_1c8;
  UResourceBundle r;
  UResourceBundle res;
  
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003daac8;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  ec = U_ZERO_ERROR;
  ures_initStackObject_63(&res);
  resB = openOlsonResource(id,&res,&ec);
  if (ec < U_ILLEGAL_ARGUMENT_ERROR) {
    ures_initStackObject_63(&r);
    ures_getByKey_63(&res,"links",&r,&ec);
    piVar1 = ures_getIntVector_63(&r,&size,&ec);
    indexS = -1;
    if (((-1 < index) && (ec < U_ILLEGAL_ARGUMENT_ERROR)) && (index < size)) {
      indexS = piVar1[(uint)index];
    }
    ures_close_63(&r);
  }
  else {
    indexS = -1;
  }
  ures_close_63(&res);
  if (-1 < indexS) {
    resB_00 = ures_getByKey_63(resB,"Names",(UResourceBundle *)0x0,&ec);
    if (ec < U_ILLEGAL_ARGUMENT_ERROR) {
      size = 0;
      local_1d0.p_ = ures_getStringByIndex_63(resB_00,indexS,&size,&ec);
      UnicodeString::UnicodeString((UnicodeString *)&r,'\x01',&local_1d0,size);
      UnicodeString::fastCopyFrom(__return_storage_ptr__,(UnicodeString *)&r);
      UnicodeString::~UnicodeString((UnicodeString *)&r);
      local_1c8 = local_1d0.p_;
    }
    ures_close_63(resB_00);
  }
  ures_close_63(resB);
  return __return_storage_ptr__;
}

Assistant:

const UnicodeString U_EXPORT2
TimeZone::getEquivalentID(const UnicodeString& id, int32_t index) {
    U_DEBUG_TZ_MSG(("gEI(%d)\n", index));
    UnicodeString result;
    UErrorCode ec = U_ZERO_ERROR;
    UResourceBundle res;
    ures_initStackObject(&res);
    UResourceBundle *top = openOlsonResource(id, res, ec);
    int32_t zone = -1;
    if (U_SUCCESS(ec)) {
        UResourceBundle r;
        ures_initStackObject(&r);
        int32_t size;
        ures_getByKey(&res, kLINKS, &r, &ec);
        const int32_t* v = ures_getIntVector(&r, &size, &ec);
        if (U_SUCCESS(ec)) {
            if (index >= 0 && index < size) {
                zone = v[index];
            }
        }
        ures_close(&r);
    }
    ures_close(&res);
    if (zone >= 0) {
        UResourceBundle *ares = ures_getByKey(top, kNAMES, NULL, &ec); // dereference Zones section
        if (U_SUCCESS(ec)) {
            int32_t idLen = 0;
            const UChar* id2 = ures_getStringByIndex(ares, zone, &idLen, &ec);
            result.fastCopyFrom(UnicodeString(TRUE, id2, idLen));
            U_DEBUG_TZ_MSG(("gei(%d) -> %d, len%d, %s\n", index, zone, result.length(), u_errorName(ec)));
        }
        ures_close(ares);
    }
    ures_close(top);
#if defined(U_DEBUG_TZ)
    if(result.length() ==0) {
      U_DEBUG_TZ_MSG(("equiv [__, #%d] -> 0 (%s)\n", index, u_errorName(ec)));
    }
#endif
    return result;
}